

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O3

uint __thiscall
Assimp::SpatialSort::GenerateMappingTable
          (SpatialSort *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *fill,
          ai_real pRadius)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  pointer pEVar4;
  uint uVar5;
  pointer puVar6;
  pointer puVar7;
  long lVar8;
  pointer pEVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pEVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  value_type_conflict1 local_1c;
  
  local_1c = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (fill,((long)(this->mPositions).
                         super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->mPositions).
                         super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
             &local_1c);
  pEVar9 = (this->mPositions).
           super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mPositions).
      super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish == pEVar9) {
    uVar11 = 0;
    puVar6 = (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = 0;
  }
  else {
    puVar6 = (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    uVar12 = 0;
    do {
      fVar15 = pEVar9[uVar12].mPosition.y;
      fVar16 = (this->mPlaneNormal).y;
      fVar17 = pEVar9[uVar12].mPosition.x;
      fVar18 = (this->mPlaneNormal).x;
      fVar2 = pEVar9[uVar12].mPosition.z;
      fVar3 = (this->mPlaneNormal).z;
      puVar6[pEVar9[uVar12].mIndex] = uVar5;
      pEVar4 = (this->mPositions).
               super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = uVar12 + 1;
      puVar6 = (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar7 = (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pEVar9 = pEVar4;
      if (uVar13 < (ulong)((long)puVar7 - (long)puVar6 >> 2)) {
        fVar15 = fVar2 * fVar3 + fVar17 * fVar18 + fVar15 * fVar16 + pRadius;
        pEVar9 = (this->mPositions).
                 super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pEVar9[uVar13].mDistance <= fVar15 && fVar15 != pEVar9[uVar13].mDistance) {
          pEVar14 = pEVar9 + uVar13;
          lVar8 = uVar12 * 0x14 + 0x38;
          uVar11 = uVar13;
          do {
            uVar13 = uVar11;
            fVar16 = (pEVar14->mPosition).x - pEVar4[uVar12].mPosition.x;
            fVar17 = (pEVar14->mPosition).y - pEVar4[uVar12].mPosition.y;
            fVar18 = (pEVar14->mPosition).z - pEVar4[uVar12].mPosition.z;
            if (pRadius * pRadius <= fVar18 * fVar18 + fVar16 * fVar16 + fVar17 * fVar17)
            goto LAB_003be137;
            puVar6[pEVar14->mIndex] = uVar5;
            uVar11 = uVar13 + 1;
            puVar6 = (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            puVar7 = (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                     .super__Vector_impl_data._M_finish;
            pEVar9 = (this->mPositions).
                     super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)puVar7 - (long)puVar6 >> 2) <= uVar11) break;
            pfVar1 = (float *)((long)&pEVar9->mIndex + lVar8);
            pEVar14 = pEVar9 + uVar11;
            lVar8 = lVar8 + 0x14;
          } while (*pfVar1 <= fVar15 && fVar15 != *pfVar1);
          uVar13 = uVar13 + 1;
        }
      }
LAB_003be137:
      uVar5 = uVar5 + 1;
      uVar11 = ((long)(this->mPositions).
                      super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar9 >> 2) *
               -0x3333333333333333;
      uVar12 = uVar13;
    } while (uVar13 < uVar11);
  }
  if ((long)puVar7 - (long)puVar6 != 0) {
    lVar8 = (long)puVar7 - (long)puVar6 >> 2;
    lVar10 = 0;
    do {
      if (uVar11 <= puVar6[lVar10]) {
        __assert_fail("fill[i]<mPositions.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/SpatialSort.cpp"
                      ,0x151,
                      "unsigned int Assimp::SpatialSort::GenerateMappingTable(std::vector<unsigned int> &, ai_real) const"
                     );
      }
      lVar10 = lVar10 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar10);
  }
  return uVar5;
}

Assistant:

unsigned int SpatialSort::GenerateMappingTable(std::vector<unsigned int>& fill, ai_real pRadius) const
{
    fill.resize(mPositions.size(),UINT_MAX);
    ai_real dist, maxDist;

    unsigned int t=0;
    const ai_real pSquared = pRadius*pRadius;
    for (size_t i = 0; i < mPositions.size();) {
        dist = mPositions[i].mPosition * mPlaneNormal;
        maxDist = dist + pRadius;

        fill[mPositions[i].mIndex] = t;
        const aiVector3D& oldpos = mPositions[i].mPosition;
        for (++i; i < fill.size() && mPositions[i].mDistance < maxDist
            && (mPositions[i].mPosition - oldpos).SquareLength() < pSquared; ++i)
        {
            fill[mPositions[i].mIndex] = t;
        }
        ++t;
    }

#ifdef ASSIMP_BUILD_DEBUG

    // debug invariant: mPositions[i].mIndex values must range from 0 to mPositions.size()-1
    for (size_t i = 0; i < fill.size(); ++i) {
        ai_assert(fill[i]<mPositions.size());
    }

#endif
    return t;
}